

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

SVInt * __thiscall slang::SVInt::assignSlowCase(SVInt *this,SVInt *rhs)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint64_t *puVar4;
  byte bVar5;
  int iVar6;
  
  if (this == rhs) {
    return this;
  }
  uVar2 = (rhs->super_SVIntStorage).bitWidth;
  bVar5 = (rhs->super_SVIntStorage).unknownFlag;
  if (uVar2 < 0x41 && (bVar5 & 1) == 0) {
    puVar4 = (this->super_SVIntStorage).field_0.pVal;
    if (puVar4 != (uint64_t *)0x0) {
      operator_delete__(puVar4);
    }
    (this->super_SVIntStorage).field_0 = (rhs->super_SVIntStorage).field_0;
    goto LAB_002bf788;
  }
  uVar3 = (this->super_SVIntStorage).bitWidth;
  bVar1 = (this->super_SVIntStorage).unknownFlag;
  if (uVar3 < 0x41 && (bVar1 & 1U) == 0) {
LAB_002bf75d:
    iVar6 = (uVar2 + 0x3f >> 6) << (bVar5 & 0x1f);
LAB_002bf75f:
    puVar4 = (uint64_t *)operator_new__((ulong)(uint)(iVar6 << 3));
    (this->super_SVIntStorage).field_0.pVal = puVar4;
  }
  else {
    iVar6 = (uVar2 + 0x3f >> 6) << (bVar5 & 0x1f);
    puVar4 = (this->super_SVIntStorage).field_0.pVal;
    if ((uVar3 + 0x3f >> 6) << (bVar1 & 0x1fU) != iVar6) {
      if (puVar4 != (uint64_t *)0x0) {
        operator_delete__(puVar4);
        uVar2 = (rhs->super_SVIntStorage).bitWidth;
        bVar5 = (rhs->super_SVIntStorage).unknownFlag;
        goto LAB_002bf75d;
      }
      goto LAB_002bf75f;
    }
  }
  memcpy(puVar4,(rhs->super_SVIntStorage).field_0.pVal,
         (ulong)((((rhs->super_SVIntStorage).bitWidth + 0x3f >> 6) <<
                 ((rhs->super_SVIntStorage).unknownFlag & 0x1fU)) << 3));
LAB_002bf788:
  (this->super_SVIntStorage).bitWidth = (rhs->super_SVIntStorage).bitWidth;
  (this->super_SVIntStorage).signFlag = (rhs->super_SVIntStorage).signFlag;
  (this->super_SVIntStorage).unknownFlag = (rhs->super_SVIntStorage).unknownFlag;
  return this;
}

Assistant:

SVInt& SVInt::assignSlowCase(const SVInt& rhs) {
    if (this == &rhs)
        return *this;

    if (rhs.isSingleWord()) {
        delete[] pVal;
        val = rhs.val;
    }
    else {
        if (isSingleWord()) {
            pVal = new uint64_t[rhs.getNumWords()];
        }
        else if (getNumWords() != rhs.getNumWords()) {
            delete[] pVal;
            pVal = new uint64_t[rhs.getNumWords()];
        }
        memcpy(pVal, rhs.pVal, rhs.getNumWords() * WORD_SIZE);
    }
    bitWidth = rhs.bitWidth;
    signFlag = rhs.signFlag;
    unknownFlag = rhs.unknownFlag;
    return *this;
}